

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JnHelperMethod.cpp
# Opt level: O2

intptr_t IR::GetMethodAddress(ThreadContextInfo *context,HelperCallOpnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uintptr_t uVar4;
  intptr_t iVar5;
  
  if (opnd == (HelperCallOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JnHelperMethod.cpp"
                       ,0x65,"(opnd)","opnd");
    if (!bVar2) goto LAB_00521f07;
    *puVar3 = 0;
  }
  bVar2 = HelperCallOpnd::IsDiagHelperCallOpnd(opnd);
  if (bVar2) {
    if ((ulong)*(uint *)&opnd->field_0x14 < 0x11) {
      uVar4 = ShiftAddr(context,*(uintptr_t *)
                                 (helperMethodWrappers + (ulong)*(uint *)&opnd->field_0x14 * 8));
      return uVar4;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JnHelperMethod.cpp"
                       ,0x7a,"(0)","Unsupported arg count (need to implement).");
    if (!bVar2) {
LAB_00521f07:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  iVar5 = GetMethodOriginalAddress(context,opnd->m_fnHelper);
  return iVar5;
}

Assistant:

intptr_t
GetMethodAddress(ThreadContextInfo * context, IR::HelperCallOpnd* opnd)
{
    Assert(opnd);
#ifdef ENABLE_SCRIPT_DEBUGGING
#if defined(_M_ARM32_OR_ARM64)
#define LowererMDFinal LowererMD
#else
#define LowererMDFinal LowererMDArch
#endif

    CompileAssert(_countof(helperMethodWrappers) == LowererMDFinal::MaxArgumentsToHelper + 1);

    if (opnd->IsDiagHelperCallOpnd())
    {
        // Note: all arguments are already loaded for the original helper. Here we just return the address.
        IR::DiagHelperCallOpnd* diagOpnd = (IR::DiagHelperCallOpnd*)opnd;

        if (0 <= diagOpnd->m_argCount && diagOpnd->m_argCount <= LowererMDFinal::MaxArgumentsToHelper)
        {
            return ShiftAddr(context, helperMethodWrappers[diagOpnd->m_argCount]);
        }
        else
        {
            AssertMsg(FALSE, "Unsupported arg count (need to implement).");
        }
    }
#endif
    return GetMethodOriginalAddress(context, opnd->m_fnHelper);
}